

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O0

void __thiscall
ThreadedReplayer::set_application_info
          (ThreadedReplayer *this,Hash param_1,VkApplicationInfo *app,
          VkPhysicalDeviceFeatures2 *features)

{
  PFN_vkCreatePipelineCache p_Var1;
  PFN_vkCreateValidationCacheEXT p_Var2;
  bool bVar3;
  uint uVar4;
  VkResult VVar5;
  PerThreadData *pPVar6;
  VulkanDevice *this_00;
  pointer pVVar7;
  ulong uVar8;
  VkPhysicalDeviceShaderModuleIdentifierPropertiesEXT *pVVar9;
  char *pcVar10;
  DatabaseInterface *pDVar11;
  pointer pDVar12;
  FILE *pFVar13;
  size_type __new_size;
  uchar *puVar14;
  size_t sVar15;
  VkDevice pVVar16;
  duration dVar17;
  duration<long,_std::ratio<1L,_1000000000L>_> local_170;
  duration<long,_std::ratio<1L,_1000L>_> local_168;
  rep local_160;
  long time_ms;
  time_point end_device;
  size_t len_1;
  FILE *file_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> on_disk_cache_1;
  VkValidationCacheCreateInfoEXT info_1;
  size_t len;
  FILE *file;
  vector<unsigned_char,_std::allocator<unsigned_char>_> on_disk_cache;
  VkPipelineCacheCreateInfo info;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> foz_path;
  string path;
  char local_68 [4];
  uint i;
  char uuid_string [33];
  VkPhysicalDeviceShaderModuleIdentifierPropertiesEXT *props;
  time_point start_device;
  VkPhysicalDeviceFeatures2 *features_local;
  VkApplicationInfo *app_local;
  Hash param_1_local;
  ThreadedReplayer *this_local;
  
  start_device.__d.__r = (duration)(duration)features;
  pPVar6 = get_per_thread_data(this);
  if ((pPVar6->expected_tag == RESOURCE_APPLICATION_INFO) && ((this->device_was_init & 1U) == 0)) {
    begin_heartbeat();
    this->device_was_init = true;
    this_00 = (VulkanDevice *)operator_new(0x1318);
    Fossilize::VulkanDevice::VulkanDevice(this_00);
    std::unique_ptr<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>::reset
              (&this->device,this_00);
    (this->device_opts).application_info = app;
    (this->device_opts).features = (VkPhysicalDeviceFeatures2 *)start_device.__d.__r;
    (this->device_opts).want_pipeline_stats = (bool)((this->opts).pipeline_stats & 1);
    props = (VkPhysicalDeviceShaderModuleIdentifierPropertiesEXT *)
            std::chrono::_V2::steady_clock::now();
    pVVar7 = std::unique_ptr<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
             ::operator->(&this->device);
    bVar3 = Fossilize::VulkanDevice::init_device(pVVar7,&this->device_opts);
    if (!bVar3) {
      fprintf(_stderr,"Fossilize ERROR: Failed to create Vulkan device, bailing ...\n");
      fflush(_stderr);
      exit(1);
    }
    pVVar7 = std::unique_ptr<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
             ::operator->(&this->device);
    Fossilize::VulkanDevice::set_validation_error_callback(pVVar7,on_validation_error,this);
    if (((this->opts).pipeline_stats & 1U) != 0) {
      pVVar7 = std::
               unique_ptr<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>::
               operator->(&this->device);
      bVar3 = Fossilize::VulkanDevice::has_pipeline_stats(pVVar7);
      if (!bVar3) {
        fprintf(_stderr,
                "Fossilize INFO: Requested pipeline stats, but device does not support them. Disabling.\n"
               );
        fflush(_stderr);
        (this->opts).pipeline_stats = false;
      }
    }
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) == 0) {
      pVVar7 = std::
               unique_ptr<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>::
               operator->(&this->device);
      bVar3 = Fossilize::VulkanDevice::module_identifiers_enabled(pVVar7);
      if (bVar3) {
        pVVar7 = std::
                 unique_ptr<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                 ::operator->(&this->device);
        pVVar9 = Fossilize::VulkanDevice::get_module_identifier_properties(pVVar7);
        for (path.field_2._12_4_ = 0; (uint)path.field_2._12_4_ < 0x10;
            path.field_2._12_4_ = path.field_2._12_4_ + 1) {
          sprintf(local_68 + (uint)(path.field_2._12_4_ << 1),"%02x",
                  (ulong)pVVar9->shaderModuleIdentifierAlgorithmUUID[(uint)path.field_2._12_4_]);
        }
        report_module_uuid((char (*) [33])local_68);
        std::__cxx11::string::string
                  ((string *)(foz_path.field_2._M_local_buf + 8),
                   (string *)&(this->opts).on_disk_module_identifier_path);
        std::__cxx11::string::operator+=((string *)(foz_path.field_2._M_local_buf + 8),'.');
        std::__cxx11::string::operator+=((string *)(foz_path.field_2._M_local_buf + 8),local_68);
        std::__cxx11::string::operator+=((string *)(foz_path.field_2._M_local_buf + 8),".foz");
        pcVar10 = (char *)std::__cxx11::string::c_str();
        pDVar11 = Fossilize::create_stream_archive_database(pcVar10,Append);
        std::
        unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
        ::reset(&this->module_identifier_db,pDVar11);
        pDVar12 = std::
                  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                  ::operator->(&this->module_identifier_db);
        uVar4 = (*pDVar12->_vptr_DatabaseInterface[2])();
        if ((uVar4 & 1) == 0) {
          fprintf(_stderr,
                  "Fossilize WARN: Failed to prepare module identifier database. Disabling identifiers.\n"
                 );
          fflush(_stderr);
          std::
          unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
          ::reset(&this->module_identifier_db,(pointer)0x0);
        }
        std::__cxx11::string::~string((string *)(foz_path.field_2._M_local_buf + 8));
      }
    }
    if (((this->opts).pipeline_stats & 1U) != 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &info.pInitialData,&(this->opts).pipeline_stats_path,".__tmp.foz");
      pcVar10 = (char *)std::__cxx11::string::c_str();
      pDVar11 = Fossilize::create_stream_archive_database(pcVar10,OverWrite);
      std::
      unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>::
      reset(&this->pipeline_stats_db,pDVar11);
      pDVar12 = std::
                unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                ::operator->(&this->pipeline_stats_db);
      uVar4 = (*pDVar12->_vptr_DatabaseInterface[2])();
      if ((uVar4 & 1) == 0) {
        fprintf(_stderr,
                "Fossilize WARN: Failed to prepare stats database. Disabling pipeline stats.\n");
        fflush(_stderr);
        std::
        unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
        ::reset(&this->pipeline_stats_db,(pointer)0x0);
        (this->opts).pipeline_stats = false;
      }
      std::__cxx11::string::~string((string *)&info.pInitialData);
    }
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) == 0) {
      memset(&on_disk_cache.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0,0x28);
      on_disk_cache.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 0x11;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&file);
      pcVar10 = (char *)std::__cxx11::string::c_str();
      pFVar13 = fopen(pcVar10,"rb");
      if (pFVar13 != (FILE *)0x0) {
        fseek(pFVar13,0,2);
        __new_size = ftell(pFVar13);
        rewind(pFVar13);
        if (__new_size != 0) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&file,__new_size);
          puVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&file);
          sVar15 = fread(puVar14,1,__new_size,pFVar13);
          if (sVar15 == __new_size) {
            bVar3 = validate_pipeline_cache_header
                              (this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&file);
            if (bVar3) {
              info.initialDataSize =
                   (size_t)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&file
                                     );
              info._16_8_ = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       &file);
            }
            else {
              fprintf(_stderr,
                      "Fossilize INFO: Failed to validate pipeline cache. Creating a blank one.\n");
              fflush(_stderr);
            }
          }
        }
      }
      p_Var1 = vkCreatePipelineCache;
      pVVar7 = std::
               unique_ptr<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>::
               operator->(&this->device);
      pVVar16 = Fossilize::VulkanDevice::get_device(pVVar7);
      VVar5 = (*p_Var1)(pVVar16,(VkPipelineCacheCreateInfo *)
                                &on_disk_cache.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,
                        (VkAllocationCallbacks *)0x0,&this->disk_pipeline_cache);
      if (VVar5 != VK_SUCCESS) {
        fprintf(_stderr,
                "Fossilize WARN: Failed to create pipeline cache, trying to create a blank one.\n");
        fflush(_stderr);
        p_Var1 = vkCreatePipelineCache;
        info.flags = 0;
        info._20_4_ = 0;
        info.initialDataSize = 0;
        pVVar7 = std::
                 unique_ptr<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                 ::operator->(&this->device);
        pVVar16 = Fossilize::VulkanDevice::get_device(pVVar7);
        VVar5 = (*p_Var1)(pVVar16,(VkPipelineCacheCreateInfo *)
                                  &on_disk_cache.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (VkAllocationCallbacks *)0x0,&this->disk_pipeline_cache);
        if (VVar5 != VK_SUCCESS) {
          fprintf(_stderr,"Fossilize ERROR: Failed to create pipeline cache.\n");
          fflush(_stderr);
          this->disk_pipeline_cache = (VkPipelineCache)0x0;
        }
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&file);
    }
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) == 0) {
      pVVar7 = std::
               unique_ptr<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>::
               operator->(&this->device);
      bVar3 = Fossilize::VulkanDevice::has_validation_cache(pVVar7);
      if (bVar3) {
        memset(&on_disk_cache_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,0,0x28);
        on_disk_cache_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = 0x3b9d3b00;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&file_1);
        pcVar10 = (char *)std::__cxx11::string::c_str();
        pFVar13 = fopen(pcVar10,"rb");
        if (pFVar13 != (FILE *)0x0) {
          fseek(pFVar13,0,2);
          end_device.__d.__r = (duration)ftell(pFVar13);
          rewind(pFVar13);
          if (end_device.__d.__r != 0) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&file_1,
                       (size_type)end_device.__d.__r);
            puVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&file_1);
            dVar17.__r = fread(puVar14,1,end_device.__d.__r,pFVar13);
            if ((duration)dVar17.__r == end_device.__d.__r) {
              bVar3 = validate_validation_cache_header
                                (this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      &file_1);
              if (bVar3) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&file_1);
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&file_1);
              }
              else {
                fprintf(_stderr,
                        "Fossilize INFO: Failed to validate validation cache. Creating a blank one.\n"
                       );
                fflush(_stderr);
              }
            }
          }
        }
        p_Var2 = vkCreateValidationCacheEXT;
        pVVar7 = std::
                 unique_ptr<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                 ::operator->(&this->device);
        pVVar16 = Fossilize::VulkanDevice::get_device(pVVar7);
        VVar5 = (*p_Var2)(pVVar16,(VkValidationCacheCreateInfoEXT *)
                                  &on_disk_cache_1.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (VkAllocationCallbacks *)0x0,&this->validation_cache);
        if (VVar5 != VK_SUCCESS) {
          fprintf(_stderr,
                  "Fossilize WARN: Failed to create validation cache, trying to create a blank one.\n"
                 );
          fflush(_stderr);
          p_Var2 = vkCreateValidationCacheEXT;
          pVVar7 = std::
                   unique_ptr<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                   ::operator->(&this->device);
          pVVar16 = Fossilize::VulkanDevice::get_device(pVVar7);
          VVar5 = (*p_Var2)(pVVar16,(VkValidationCacheCreateInfoEXT *)
                                    &on_disk_cache_1.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (VkAllocationCallbacks *)0x0,&this->validation_cache);
          if (VVar5 != VK_SUCCESS) {
            fprintf(_stderr,"Fossilize ERROR: Failed to create validation cache.\n");
            fflush(_stderr);
            this->validation_cache = (VkValidationCacheEXT)0x0;
          }
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&file_1);
      }
      else {
        fprintf(_stderr,
                "Fossilize ERROR: Requested validation cache, but validation layers do not support this extension.\n"
               );
        fflush(_stderr);
      }
    }
    uVar8 = std::__cxx11::string::empty();
    if (((uVar8 & 1) == 0) && (bVar3 = init_replayer_cache(this), !bVar3)) {
      fprintf(_stderr,"Fossilize WARN: Failed to initialize replayer cache. Ignoring!\n");
      fflush(_stderr);
    }
    time_ms = std::chrono::_V2::steady_clock::now();
    local_170.__r =
         (rep)std::chrono::operator-
                        ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          *)&time_ms,
                         (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          *)&props);
    local_168.__r =
         (rep)std::chrono::
              duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                        (&local_170);
    local_160 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_168);
    fprintf(_stderr,"Fossilize INFO: Creating Vulkan device took: %ld ms\n",local_160);
    fflush(_stderr);
    if (app != (VkApplicationInfo *)0x0) {
      fprintf(_stderr,"Fossilize INFO: Replaying for application:\n");
      fflush(_stderr);
      fprintf(_stderr,"Fossilize INFO:   apiVersion: %u.%u.%u\n",(ulong)(app->apiVersion >> 0x16),
              (ulong)(app->apiVersion >> 0xc & 0x3ff),(ulong)(app->apiVersion & 0xfff));
      fflush(_stderr);
      fprintf(_stderr,"Fossilize INFO:   engineVersion: %u\n",(ulong)app->engineVersion);
      fflush(_stderr);
      fprintf(_stderr,"Fossilize INFO:   applicationVersion: %u\n",(ulong)app->applicationVersion);
      fflush(_stderr);
      if (app->pEngineName != (char *)0x0) {
        fprintf(_stderr,"Fossilize INFO:   engineName: %s\n",app->pEngineName);
        fflush(_stderr);
      }
      if (app->pApplicationName != (char *)0x0) {
        fprintf(_stderr,"Fossilize INFO:   applicationName: %s\n",app->pApplicationName);
        fflush(_stderr);
      }
    }
  }
  return;
}

Assistant:

void set_application_info(Hash, const VkApplicationInfo *app, const VkPhysicalDeviceFeatures2 *features) override
	{
		// TODO: Could use this to create multiple VkDevices for replay as necessary if app changes.
		if (get_per_thread_data().expected_tag != RESOURCE_APPLICATION_INFO)
			return;

		if (!device_was_init)
		{
			// From this point on, we expect forward progress in finite time.
			// If the Vulkan driver is unstable and deadlocks, we'll be able to detect it and kill the process.
			begin_heartbeat();

			// Now we can init the device with correct app info.
			device_was_init = true;
			device.reset(new VulkanDevice);
			device_opts.application_info = app;
			device_opts.features = features;
			device_opts.want_pipeline_stats = opts.pipeline_stats;
			auto start_device = chrono::steady_clock::now();
			if (!device->init_device(device_opts))
			{
				LOGE("Failed to create Vulkan device, bailing ...\n");
				exit(EXIT_FAILURE);
			}

			device->set_validation_error_callback(on_validation_error, this);

			if (opts.pipeline_stats && !device->has_pipeline_stats())
			{
				LOGI("Requested pipeline stats, but device does not support them. Disabling.\n");
				opts.pipeline_stats = false;
			}

			if (!opts.on_disk_module_identifier_path.empty() && device->module_identifiers_enabled())
			{
				auto &props = device->get_module_identifier_properties();
				char uuid_string[2 * VK_UUID_SIZE + 1];
				for (unsigned i = 0; i < VK_UUID_SIZE; i++)
					sprintf(uuid_string + 2 * i, "%02x", props.shaderModuleIdentifierAlgorithmUUID[i]);

				report_module_uuid(uuid_string);

				auto path = opts.on_disk_module_identifier_path;
				path += '.';
				path += uuid_string;
				path += ".foz";
				module_identifier_db.reset(create_stream_archive_database(path.c_str(), DatabaseMode::Append));
				if (!module_identifier_db->prepare())
				{
					LOGW("Failed to prepare module identifier database. Disabling identifiers.\n");
					module_identifier_db.reset();
				}
			}

			if (opts.pipeline_stats)
			{
				auto foz_path = opts.pipeline_stats_path + ".__tmp.foz";
				pipeline_stats_db.reset(create_stream_archive_database(foz_path.c_str(), DatabaseMode::OverWrite));
				if (!pipeline_stats_db->prepare())
				{
					LOGW("Failed to prepare stats database. Disabling pipeline stats.\n");
					pipeline_stats_db.reset();
					opts.pipeline_stats = false;
				}
			}

			if (!opts.on_disk_pipeline_cache_path.empty())
			{
				VkPipelineCacheCreateInfo info = { VK_STRUCTURE_TYPE_PIPELINE_CACHE_CREATE_INFO };
				vector<uint8_t> on_disk_cache;

				// Try to load on-disk cache.
				FILE *file = fopen(opts.on_disk_pipeline_cache_path.c_str(), "rb");
				if (file)
				{
					fseek(file, 0, SEEK_END);
					size_t len = ftell(file);
					rewind(file);

					if (len != 0)
					{
						on_disk_cache.resize(len);
						if (fread(on_disk_cache.data(), 1, len, file) == len)
						{
							if (validate_pipeline_cache_header(on_disk_cache))
							{
								info.pInitialData = on_disk_cache.data();
								info.initialDataSize = on_disk_cache.size();
							}
							else
								LOGI("Failed to validate pipeline cache. Creating a blank one.\n");
						}
					}
				}

				if (vkCreatePipelineCache(device->get_device(), &info, nullptr, &disk_pipeline_cache) != VK_SUCCESS)
				{
					LOGW("Failed to create pipeline cache, trying to create a blank one.\n");
					info.initialDataSize = 0;
					info.pInitialData = nullptr;
					if (vkCreatePipelineCache(device->get_device(), &info, nullptr, &disk_pipeline_cache) != VK_SUCCESS)
					{
						LOGE("Failed to create pipeline cache.\n");
						disk_pipeline_cache = VK_NULL_HANDLE;
					}
				}
			}

			if (!opts.on_disk_validation_cache_path.empty())
			{
				if (device->has_validation_cache())
				{
					VkValidationCacheCreateInfoEXT info = {VK_STRUCTURE_TYPE_VALIDATION_CACHE_CREATE_INFO_EXT };
					vector<uint8_t> on_disk_cache;

					FILE *file = fopen(opts.on_disk_validation_cache_path.c_str(), "rb");
					if (file)
					{
						fseek(file, 0, SEEK_END);
						size_t len = ftell(file);
						rewind(file);

						if (len != 0)
						{
							on_disk_cache.resize(len);
							if (fread(on_disk_cache.data(), 1, len, file) == len)
							{
								if (validate_validation_cache_header(on_disk_cache))
								{
									info.pInitialData = on_disk_cache.data();
									info.initialDataSize = on_disk_cache.size();
								}
								else
									LOGI("Failed to validate validation cache. Creating a blank one.\n");
							}
						}
					}

					if (vkCreateValidationCacheEXT(device->get_device(), &info, nullptr, &validation_cache) != VK_SUCCESS)
					{
						LOGW("Failed to create validation cache, trying to create a blank one.\n");
						info.initialDataSize = 0;
						info.pInitialData = nullptr;
						if (vkCreateValidationCacheEXT(device->get_device(), &info, nullptr, &validation_cache) != VK_SUCCESS)
						{
							LOGE("Failed to create validation cache.\n");
							validation_cache = VK_NULL_HANDLE;
						}
					}
				}
				else
				{
					LOGE("Requested validation cache, but validation layers do not support this extension.\n");
				}
			}

			if (!opts.replayer_cache_path.empty())
				if (!init_replayer_cache())
					LOGW("Failed to initialize replayer cache. Ignoring!\n");

			auto end_device = chrono::steady_clock::now();
			long time_ms = chrono::duration_cast<chrono::milliseconds>(end_device - start_device).count();
			LOGI("Creating Vulkan device took: %ld ms\n", time_ms);

			if (app)
			{
				LOGI("Replaying for application:\n");
				LOGI("  apiVersion: %u.%u.%u\n",
				     VK_VERSION_MAJOR(app->apiVersion),
				     VK_VERSION_MINOR(app->apiVersion),
				     VK_VERSION_PATCH(app->apiVersion));
				LOGI("  engineVersion: %u\n", app->engineVersion);
				LOGI("  applicationVersion: %u\n", app->applicationVersion);
				if (app->pEngineName)
					LOGI("  engineName: %s\n", app->pEngineName);
				if (app->pApplicationName)
					LOGI("  applicationName: %s\n", app->pApplicationName);
			}
		}
	}